

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

bool goodform::is<double>(any *v)

{
  bool bVar1;
  type_info *this;
  
  this = std::any::type(v);
  bVar1 = std::type_info::operator==(this,(type_info *)&double::typeinfo);
  return bVar1;
}

Assistant:

bool is(const any& v)
  {
    return v.type() == typeid(T);
  }